

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O0

void __thiscall
HSimplexNla::reportArray
          (HSimplexNla *this,string *message,HighsInt offset,HVector *vector,bool force)

{
  undefined8 uVar1;
  const_reference pvVar2;
  long in_RCX;
  string *in_RSI;
  long *in_RDI;
  byte in_R8B;
  HighsInt iRow;
  HighsInt num_row;
  bool in_stack_000000a7;
  HVector *in_stack_000000a8;
  HighsInt in_stack_000000b4;
  string *in_stack_000000b8;
  HSimplexNla *in_stack_000000c0;
  int local_58;
  string local_48 [32];
  int local_28;
  byte local_21;
  long local_20;
  
  local_21 = in_R8B & 1;
  if (((*(byte *)(in_RDI + 0xf5) & 1) != 0) || (local_21 != 0)) {
    local_28 = *(int *)(*in_RDI + 4);
    if (local_28 < 0x1a) {
      local_20 = in_RCX;
      uVar1 = std::__cxx11::string::c_str();
      printf("%s",uVar1);
      for (local_58 = 0; local_58 < local_28; local_58 = local_58 + 1) {
        if ((0 < local_58) && (local_58 % 10 == 0)) {
          printf("\n                                 ");
        }
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                            (long)local_58);
        printf("%11.4g ",*pvVar2);
      }
      printf("\n");
    }
    else {
      std::__cxx11::string::string(local_48,in_RSI);
      reportArraySparse(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000a8,
                        in_stack_000000a7);
      std::__cxx11::string::~string(local_48);
    }
  }
  return;
}

Assistant:

void HSimplexNla::reportArray(const std::string message, const HighsInt offset,
                              const HVector* vector, const bool force) const {
  if (!report_ && !force) return;
  const HighsInt num_row = lp_->num_row_;
  if (num_row > kReportItemLimit) {
    reportArraySparse(message, offset, vector, force);
  } else {
    printf("%s", message.c_str());
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      if (iRow > 0 && iRow % 10 == 0)
        printf("\n                                 ");
      printf("%11.4g ", vector->array[iRow]);
    }
    printf("\n");
  }
}